

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLsDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *arkode_mem,N_Vector tmp1,
              N_Vector tmp2,N_Vector tmp3)

{
  N_Vector_Ops p_Var1;
  int iVar2;
  SUNMatrix_ID SVar3;
  ARKRhsFn fi;
  char *msgfmt;
  realtype t_00;
  ARKLsMem arkls_mem;
  realtype local_40;
  ARKodeMem ark_mem;
  
  local_40 = t;
  iVar2 = arkLs_AccessLMem(arkode_mem,"arkLsDQJac",&ark_mem,&arkls_mem);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (Jac == (SUNMatrix)0x0) {
    msgfmt = "SUNMatrix is NULL";
    iVar2 = -2;
  }
  else {
    fi = (*ark_mem->step_getimplicitrhs)(ark_mem);
    if (fi == (ARKRhsFn)0x0) {
      msgfmt = "Time step module is missing implicit RHS fcn";
    }
    else {
      p_Var1 = ark_mem->tempv1->ops;
      if ((((p_Var1->nvcloneempty == (_func_N_Vector_N_Vector *)0x0) ||
           (p_Var1->nvwrmsnorm == (_func_realtype_N_Vector_N_Vector *)0x0)) ||
          (p_Var1->nvlinearsum == (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0))
         || (((p_Var1->nvdestroy == (_func_void_N_Vector *)0x0 ||
              (p_Var1->nvscale == (_func_void_realtype_N_Vector_N_Vector *)0x0)) ||
             ((p_Var1->nvgetarraypointer == (_func_realtype_ptr_N_Vector *)0x0 ||
              (p_Var1->nvsetarraypointer == (_func_void_realtype_ptr_N_Vector *)0x0)))))) {
        msgfmt = "A required vector operation is not implemented.";
      }
      else {
        SVar3 = SUNMatGetID(Jac);
        if (SVar3 == SUNMATRIX_DENSE) {
          iVar2 = arkLsDenseDQJac(local_40,y,fy,Jac,ark_mem,arkls_mem,fi,tmp1);
          return iVar2;
        }
        SVar3 = SUNMatGetID(Jac);
        if (SVar3 == SUNMATRIX_BAND) {
          iVar2 = arkLsBandDQJac(t_00,y,fy,Jac,ark_mem,arkls_mem,fi,tmp1,tmp2);
          return iVar2;
        }
        msgfmt = "arkLsDQJac not implemented for this SUNMatrix type!";
      }
    }
    iVar2 = -3;
  }
  arkProcessError(ark_mem,iVar2,"ARKLS","arkLsDQJac",msgfmt);
  return iVar2;
}

Assistant:

int arkLsDQJac(realtype t, N_Vector y, N_Vector fy,
               SUNMatrix Jac, void *arkode_mem, N_Vector tmp1,
               N_Vector tmp2, N_Vector tmp3)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  ARKRhsFn  fi;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLsDQJac",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* verify that Jac is non-NULL */
  if (Jac == NULL) {
    arkProcessError(ark_mem, ARKLS_LMEM_NULL, "ARKLS",
                    "arkLsDQJac", "SUNMatrix is NULL");
    return(ARKLS_LMEM_NULL);
  }

  /* Access implicit RHS function */
  fi = ark_mem->step_getimplicitrhs((void*) ark_mem);
  if (fi == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLsDQJac",
                    "Time step module is missing implicit RHS fcn");
    return(ARKLS_ILL_INPUT);
  }

  /* Verify that N_Vector supports required routines */
  if (ark_mem->tempv1->ops->nvcloneempty == NULL ||
      ark_mem->tempv1->ops->nvwrmsnorm == NULL ||
      ark_mem->tempv1->ops->nvlinearsum == NULL ||
      ark_mem->tempv1->ops->nvdestroy == NULL ||
      ark_mem->tempv1->ops->nvscale == NULL ||
      ark_mem->tempv1->ops->nvgetarraypointer == NULL ||
      ark_mem->tempv1->ops->nvsetarraypointer == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLsDQJac", MSG_LS_BAD_NVECTOR);
    return(ARKLS_ILL_INPUT);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE) {
    retval = arkLsDenseDQJac(t, y, fy, Jac, ark_mem, arkls_mem,
                             fi, tmp1);
  } else if (SUNMatGetID(Jac) == SUNMATRIX_BAND) {
    retval = arkLsBandDQJac(t, y, fy, Jac, ark_mem, arkls_mem,
                            fi, tmp1, tmp2);
  } else {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsDQJac",
                    "arkLsDQJac not implemented for this SUNMatrix type!");
    retval = ARKLS_ILL_INPUT;
  }
  return(retval);
}